

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

_Bool fy_document_is_colorized(fy_document *fyd)

{
  fy_parse_cfg_flags fVar1;
  int iVar2;
  FILE *__stream;
  uint color_flags;
  fy_document *fyd_local;
  
  if (fyd == (fy_document *)0x0) {
    fyd_local._7_1_ = false;
  }
  else if (((fyd->parse_cfg).flags & FYPCF_COLLECT_DIAG) == FYPCF_COLOR_AUTO) {
    fVar1 = (fyd->parse_cfg).flags & (FYPCF_COLOR_FORCE|FYPCF_COLOR_NONE);
    if (fVar1 == FYPCF_COLOR_AUTO) {
      __stream = (FILE *)fy_document_get_error_fp(fyd);
      iVar2 = fileno(__stream);
      iVar2 = isatty(iVar2);
      fyd_local._7_1_ = iVar2 == 1;
    }
    else {
      fyd_local._7_1_ = fVar1 == FYPCF_COLOR_FORCE;
    }
  }
  else {
    fyd_local._7_1_ = false;
  }
  return fyd_local._7_1_;
}

Assistant:

bool fy_document_is_colorized(struct fy_document *fyd) {
    unsigned int color_flags;

    if (!fyd)
        return false;

    if (fyd->parse_cfg.flags & FYPCF_COLLECT_DIAG)
        return false;

    color_flags = fyd->parse_cfg.flags & FYPCF_COLOR(FYPCF_COLOR_MASK);
    if (color_flags == FYPCF_COLOR_AUTO)
        return isatty(fileno(fy_document_get_error_fp(fyd))) == 1;

    return color_flags == FYPCF_COLOR_FORCE;
}